

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_conv_transpose_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  size_t sVar6;
  void *__s;
  int iVar7;
  int iVar8;
  undefined2 *puVar9;
  size_t __n;
  char *pcVar10;
  undefined2 *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  undefined2 *puVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ggml_fp16_t *y;
  ggml_fp16_t *x;
  int64_t iVar23;
  undefined1 auVar24 [16];
  ggml_fp16_t *local_108;
  long local_100;
  ggml_fp16_t *local_f8;
  undefined2 *local_f0;
  long local_e0;
  long local_d8;
  long local_c8;
  float v;
  long local_b8;
  void *local_b0;
  long local_a8;
  long local_a0;
  ggml_tensor *local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ggml_tensor *local_78;
  size_t local_70;
  int64_t local_68;
  long local_60;
  long local_58;
  size_t local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type == GGML_TYPE_F16) {
    pgVar2 = dst->src[1];
    if (pgVar2->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar1->nb[0] == 2) {
          if (pgVar2->nb[0] == 4) {
            local_a0 = pgVar1->ne[0];
            lVar3 = pgVar1->ne[1];
            lVar14 = pgVar1->ne[2];
            lVar16 = pgVar1->ne[3];
            iVar23 = pgVar2->ne[0];
            local_b8 = pgVar2->ne[1];
            lVar4 = pgVar2->ne[2];
            local_68 = dst->ne[0];
            iVar5 = dst->ne[2];
            local_48 = dst->nb[2];
            iVar12 = params->ith;
            uVar21 = params->nth;
            local_a8 = lVar16 * local_a0;
            local_b0 = (void *)(lVar3 * lVar14 * local_a8);
            local_98 = dst;
            local_60 = lVar16;
            local_40 = iVar23;
            if (iVar12 == 0) {
              local_80 = local_80 & 0xffffffff00000000;
              local_50 = pgVar1->nb[2];
              local_70 = pgVar1->nb[3];
              local_90 = pgVar2->nb[1];
              sVar6 = pgVar2->nb[2];
              local_88 = (ulong)uVar21;
              local_78 = pgVar1;
              memset(params->wdata,0,params->wsize);
              iVar23 = local_40;
              local_f0 = (undefined2 *)params->wdata;
              if (0 < lVar16) {
                local_108 = (ggml_fp16_t *)0x0;
                lVar20 = 0;
                do {
                  local_58 = lVar20;
                  if (0 < lVar14) {
                    lVar20 = (long)local_78->data + (long)local_108;
                    lVar22 = 0;
                    puVar9 = local_f0;
                    do {
                      if (0 < lVar3) {
                        lVar17 = 0;
                        lVar13 = lVar20;
                        puVar18 = puVar9;
                        do {
                          if (0 < local_a0) {
                            lVar19 = 0;
                            puVar11 = puVar18;
                            do {
                              *puVar11 = *(undefined2 *)(lVar13 + lVar19 * 2);
                              lVar19 = lVar19 + 1;
                              puVar11 = puVar11 + lVar16;
                            } while (local_a0 != lVar19);
                          }
                          lVar17 = lVar17 + 1;
                          lVar13 = lVar13 + local_a0 * 2;
                          puVar18 = puVar18 + local_a8;
                        } while (lVar17 != lVar3);
                      }
                      lVar22 = lVar22 + 1;
                      lVar20 = lVar20 + local_50;
                      puVar9 = puVar9 + local_a8 * lVar3;
                    } while (lVar22 != lVar14);
                  }
                  local_108 = (ggml_fp16_t *)((long)local_108 + local_70);
                  local_f0 = local_f0 + 1;
                  lVar20 = local_58 + 1;
                } while (local_58 + 1 != local_60);
              }
              iVar12 = (int)local_80;
              if (0 < lVar4) {
                lVar14 = 0;
                lVar16 = 0;
                do {
                  if (0 < local_b8) {
                    lVar20 = (long)pgVar2->data + lVar14;
                    lVar22 = 0;
                    do {
                      if (0 < local_40) {
                        lVar13 = 0;
                        do {
                          auVar24 = vcvtps2ph_f16c(ZEXT416(*(uint *)(lVar20 + lVar13 * 4)),0);
                          vpextrw_avx(auVar24,0);
                          lVar13 = lVar13 + 1;
                        } while (local_40 != lVar13);
                      }
                      lVar22 = lVar22 + 1;
                      lVar20 = lVar20 + local_90;
                    } while (lVar22 != local_b8);
                  }
                  lVar16 = lVar16 + 1;
                  lVar14 = lVar14 + sVar6;
                } while (lVar16 != lVar4);
              }
              __s = local_98->data;
              __n = ggml_nbytes();
              memset(__s,0,__n);
              uVar21 = (uint)local_88;
            }
            ggml_barrier(params->threadpool);
            lVar14 = local_60;
            iVar7 = (int)iVar5;
            iVar8 = (int)(iVar7 + -1 + uVar21) / (int)uVar21;
            iVar12 = iVar12 * iVar8;
            iVar8 = iVar8 + iVar12;
            if (iVar7 <= iVar8) {
              iVar8 = iVar7;
            }
            local_90 = CONCAT44(local_90._4_4_,iVar8);
            if (iVar12 < iVar8) {
              local_b0 = (void *)((long)params->wdata + (long)(int)local_b0 * 2);
              local_88 = (ulong)iVar12;
              local_e0 = local_48 * local_88;
              local_80 = local_68 * local_98->op_params[0] * 4;
              local_70 = (long)local_98->op_params[0] << 2;
              local_f8 = (ggml_fp16_t *)((long)params->wdata + local_a8 * lVar3 * local_88 * 2);
              local_68 = local_68 << 2;
              local_38 = local_a8 * lVar3 * 2;
              local_a8 = local_a8 * 2;
              lVar16 = local_a0;
              do {
                if (0 < local_b8) {
                  local_100 = (long)local_98->data + local_e0;
                  local_d8 = 0;
                  do {
                    if (0 < iVar23) {
                      local_78 = (ggml_tensor *)(local_d8 * iVar23);
                      local_f0 = (undefined2 *)local_100;
                      local_c8 = 0;
                      do {
                        if (0 < lVar3) {
                          x = (ggml_fp16_t *)
                              (((local_c8 + (long)local_78) * (lVar4 << 0x20) >> 0x1f) +
                              (long)local_b0);
                          local_108 = local_f8;
                          local_58 = 0;
                          local_50 = (size_t)local_f0;
                          do {
                            if (0 < lVar16) {
                              lVar20 = 0;
                              y = local_108;
                              do {
                                v = 0.0;
                                ggml_vec_dot_f16((int)lVar14,&v,0,x,0,y,0,1);
                                *(float *)(local_50 + lVar20 * 4) =
                                     v + *(float *)(local_50 + lVar20 * 4);
                                lVar20 = lVar20 + 1;
                                y = y + lVar14;
                                lVar16 = local_a0;
                              } while (local_a0 != lVar20);
                            }
                            local_58 = local_58 + 1;
                            local_50 = local_50 + local_68;
                            local_108 = (ggml_fp16_t *)((long)local_108 + local_a8);
                          } while (local_58 != lVar3);
                        }
                        local_c8 = local_c8 + 1;
                        local_f0 = (undefined2 *)((long)local_f0 + local_70);
                        iVar23 = local_40;
                      } while (local_c8 != local_40);
                    }
                    local_d8 = local_d8 + 1;
                    local_100 = local_100 + local_80;
                  } while (local_d8 != local_b8);
                }
                local_88 = local_88 + 1;
                local_e0 = local_e0 + local_48;
                local_f8 = (ggml_fp16_t *)((long)local_f8 + local_38);
              } while ((int)local_90 != (int)local_88);
            }
            return;
          }
          pcVar10 = "nb10 == sizeof(float)";
          uVar15 = 0x1768;
        }
        else {
          pcVar10 = "nb00 == sizeof(ggml_fp16_t)";
          uVar15 = 0x1767;
        }
      }
      else {
        pcVar10 = "dst->type == GGML_TYPE_F32";
        uVar15 = 0x175e;
      }
    }
    else {
      pcVar10 = "src1->type == GGML_TYPE_F32";
      uVar15 = 0x175d;
    }
  }
  else {
    pcVar10 = "src0->type == GGML_TYPE_F16";
    uVar15 = 0x175c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar15,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

void ggml_compute_forward_conv_transpose_2d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(src0->type == GGML_TYPE_F16);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS

    const int ith = params->ith;
    const int nth = params->nth;

    const int nk = ne00*ne01*ne02*ne03;

    GGML_ASSERT(nb00 == sizeof(ggml_fp16_t));
    GGML_ASSERT(nb10 == sizeof(float));

    if (ith == 0) {
        memset(params->wdata, 0, params->wsize);

        // permute kernel data (src0) from (Kw x Kh x Cout x Cin) to (Cin x Kw x Kh x Cout)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;

            for (int64_t i03 = 0; i03 < ne03; i03++) {
                for (int64_t i02 = 0; i02 < ne02; i02++) {
                    const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i03*nb03 + i02*nb02);
                    ggml_fp16_t * dst_data = wdata + i02*ne01*ne00*ne03;
                    for (int64_t i01 = 0; i01 < ne01; i01++) {
                        for (int64_t i00 = 0; i00 < ne00; i00++) {
                            dst_data[i01*ne00*ne03 + i00*ne03 + i03] = src[i01 * ne00 + i00];
                        }
                    }
                }
            }
        }

        // permute source data (src1) from (Sw x Sh x Cin) to (Cin x Sw x Sh)
        {
            ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + nk;
            for (int i12 = 0; i12 < ne12; i12++) {
                for (int i11 = 0; i11 < ne11; i11++) {
                    const float * const src = (float *)((char *) src1->data + i12*nb12 + i11*nb11);
                    ggml_fp16_t * dst_data = wdata + i11*ne10*ne12;
                    for (int i10 = 0; i10 < ne10; i10++) {
                        dst_data[i10*ne12 + i12] = GGML_FP32_TO_FP16(src[i10]);
                    }
                }
            }
        }

        memset(dst->data, 0, ggml_nbytes(dst));
    }
    ggml_barrier(params->threadpool);

    const int32_t stride = ggml_get_op_params_i32(dst, 0);

    // total patches in dst
    const int np = ne2;

    // patches per thread
    const int dp = (np + nth - 1)/nth;

    // patch range for this thread
    const int ip0 = dp*ith;
    const int ip1 = MIN(ip0 + dp, np);

    ggml_fp16_t * const wdata = (ggml_fp16_t *) params->wdata + 0;
    ggml_fp16_t * const wdata_src = wdata + nk;

    for (int i2 = ip0; i2 < ip1; i2++) { // Cout
        float * dst_data = (float *)((char *) dst->data + i2*nb2);
        ggml_fp16_t * wdata_kernel = wdata + i2*ne01*ne00*ne03;
        for (int i11 = 0; i11 < ne11; i11++) {
            for (int i10 = 0; i10 < ne10; i10++) {
                const int i1n = i11*ne10*ne12 + i10*ne12;
                for (int i01 = 0; i01 < ne01; i01++) {
                    for (int i00 = 0; i00 < ne00; i00++) {
                        float v = 0;
                        ggml_vec_dot_f16(ne03, &v, 0,
                                wdata_src + i1n, 0,
                                wdata_kernel + i01*ne00*ne03 + i00*ne03, 0, 1);
                        dst_data[(i11*stride + i01)*ne0 + i10*stride + i00] += v;
                    }
                }
            }
        }
    }
}